

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_protocol.cc
# Opt level: O0

session * __thiscall
helix::nasdaq::nordic_itch_protocol::new_session(nordic_itch_protocol *this,void *data)

{
  bool bVar1;
  invalid_argument *this_00;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  soupfile_session<helix::nasdaq::nordic_itch_handler> *in_stack_ffffffffffffffa0;
  string local_48 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  moldudp_session<helix::nasdaq::nordic_itch_handler> *local_8;
  
  bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    local_8 = (moldudp_session<helix::nasdaq::nordic_itch_handler> *)operator_new(0x120);
    moldudp_session<helix::nasdaq::nordic_itch_handler>::moldudp_session
              (local_8,in_stack_ffffffffffffff98);
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!bVar1) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      std::invalid_argument::invalid_argument(this_00,local_48);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    local_8 = (moldudp_session<helix::nasdaq::nordic_itch_handler> *)operator_new(0x118);
    soupfile_session<helix::nasdaq::nordic_itch_handler>::soupfile_session
              (in_stack_ffffffffffffffa0,local_8);
  }
  return &local_8->super_session;
}

Assistant:

session* nordic_itch_protocol::new_session(void *data)
{
    if (_name == "nasdaq-nordic-moldudp-itch") {
        return new moldudp_session<nordic_itch_handler>(data);
    } else if (_name == "nasdaq-nordic-soupfile-itch") {
        return new soupfile_session<nordic_itch_handler>(data);
    } else {
        throw std::invalid_argument("unknown protocol: " + _name);
    }
}